

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void lemon_addtext(char *zBuf,int *pnUsed,char *zIn,int nIn,int iWidth)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  iVar4 = iWidth;
  if (nIn < 0) {
    nIn = 0xffffffff;
    pcVar3 = zIn;
    do {
      nIn = nIn + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  for (; nIn < iVar4; iVar4 = iVar4 + -1) {
    iVar2 = *pnUsed;
    *pnUsed = iVar2 + 1;
    zBuf[iVar2] = ' ';
  }
  if (nIn != 0) {
    if (nIn < iWidth) {
      iWidth = nIn;
    }
    memcpy(zBuf + *pnUsed,zIn,(ulong)(uint)nIn);
    *pnUsed = *pnUsed + nIn;
    iVar4 = -iWidth;
    while( true ) {
      iVar2 = *pnUsed;
      if (iVar4 <= nIn) break;
      *pnUsed = iVar2 + 1;
      zBuf[iVar2] = ' ';
      iVar4 = iVar4 + -1;
    }
    zBuf[iVar2] = '\0';
  }
  return;
}

Assistant:

static void lemon_addtext(
  char *zBuf,           /* The buffer to which text is added */
  int *pnUsed,          /* Slots of the buffer used so far */
  const char *zIn,      /* Text to add */
  int nIn,              /* Bytes of text to add.  -1 to use strlen() */
  int iWidth            /* Field width.  Negative to left justify */
){
  if( nIn<0 ) for(nIn=0; zIn[nIn]; nIn++){}
  while( iWidth>nIn ){ zBuf[(*pnUsed)++] = ' '; iWidth--; }
  if( nIn==0 ) return;
  memcpy(&zBuf[*pnUsed], zIn, nIn);
  *pnUsed += nIn;
  while( (-iWidth)>nIn ){ zBuf[(*pnUsed)++] = ' '; iWidth++; }
  zBuf[*pnUsed] = 0;
}